

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhashlin.c
# Opt level: O3

void * tommy_hashlin_remove(tommy_hashlin *hashlin,undefined1 *cmp,void *cmp_arg,tommy_hash_t hash)

{
  tommy_node_struct *ptVar1;
  long lVar2;
  tommy_hashlin_node *ptVar3;
  tommy_node_struct *ptVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  tommy_node_struct *ptVar8;
  tommy_node_struct *ptVar9;
  void *pvVar10;
  tommy_hashlin_node *ptVar11;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = hashlin->low_mask & hash;
  if (uVar6 < hashlin->split) {
    uVar6 = hashlin->bucket_mask & hash;
  }
  uVar5 = 0x1f;
  if ((uVar6 | 1) != 0) {
    for (; (uVar6 | 1) >> uVar5 == 0; uVar5 = uVar5 - 1) {
    }
  }
  ptVar11 = hashlin->bucket[uVar5][uVar6];
  if (ptVar11 == (tommy_hashlin_node *)0x0) {
    pvVar10 = (void *)0x0;
  }
  else {
    ptVar1 = (tommy_node_struct *)(hashlin->bucket[uVar5] + uVar6);
    pvVar10 = (void *)0x0;
    do {
      if ((ptVar11->key == hash) && (iVar7 = (*(code *)cmp)(cmp_arg,ptVar11->data), iVar7 == 0)) {
        ptVar3 = ptVar1->next;
        ptVar4 = ptVar11->next;
        ptVar8 = ptVar11->prev;
        ptVar9 = ptVar4;
        if (ptVar4 == (tommy_node_struct *)0x0) {
          ptVar9 = ptVar3;
        }
        ptVar9->prev = ptVar8;
        if (ptVar3 == ptVar11) {
          ptVar8 = ptVar1;
        }
        ptVar8->next = ptVar4;
        hashlin->count = hashlin->count - 1;
        hashlin_shrink_step(hashlin);
        pvVar10 = ptVar11->data;
        break;
      }
      ptVar11 = ptVar11->next;
    } while (ptVar11 != (tommy_node_struct *)0x0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return pvVar10;
}

Assistant:

void* tommy_hashlin_remove(tommy_hashlin* hashlin, tommy_search_func* cmp, const void* cmp_arg, tommy_hash_t hash)
{
	tommy_hashlin_node** let_ptr = tommy_hashlin_bucket_ref(hashlin, hash);
	tommy_hashlin_node* node = *let_ptr;

	while (node) {
		/* we first check if the hash matches, as in the same bucket we may have multiples hash values */
		if (node->key == hash && cmp(cmp_arg, node->data) == 0) {
			tommy_list_remove_existing(let_ptr, node);

			--hashlin->count;

			hashlin_shrink_step(hashlin);

			return node->data;
		}
		node = node->next;
	}

	return 0;
}